

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O0

void set_acls(archive_entry *ae,acl_t *acls,int n)

{
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int i;
  int iVar1;
  
  archive_entry_acl_clear((archive_entry *)0x122e0c);
  for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 1) {
    archive_entry_acl_add_entry
              ((archive_entry *)CONCAT44(n,i),(wchar_t)((ulong)in_RDI >> 0x20),(wchar_t)in_RDI,
               (wchar_t)((ulong)in_RSI >> 0x20),(wchar_t)in_RSI,(char *)CONCAT44(in_EDX,iVar1));
  }
  return;
}

Assistant:

static void
set_acls(struct archive_entry *ae, struct acl_t *acls, int n)
{
	int i;

	archive_entry_acl_clear(ae);
	for (i = 0; i < n; i++) {
		failure("type=%d, permset=%d, tag=%d, qual=%d name=%s",
		    acls[i].type, acls[i].permset, acls[i].tag,
		    acls[i].qual, acls[i].name);
		assertEqualInt(ARCHIVE_OK,
		    archive_entry_acl_add_entry(ae,
			acls[i].type, acls[i].permset, acls[i].tag,
			acls[i].qual, acls[i].name));
	}
}